

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::remove_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  CVmHashEntry *__filename;
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t in_ESI;
  CVmObjTable *in_RDI;
  CVmHashEntryPLI *entry;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  __filename = CVmHashTable::find((CVmHashTable *)in_RDI,
                                  (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                                  in_stack_ffffffffffffffe8);
  if (__filename != (CVmHashEntry *)0x0) {
    CVmHashTable::remove(in_RDI->post_load_init_table_,(char *)__filename);
    if (__filename != (CVmHashEntry *)0x0) {
      (*__filename->_vptr_CVmHashEntry[1])();
    }
    pCVar1 = get_entry(in_RDI,in_ESI);
    *(ushort *)&pCVar1->field_0x14 = *(ushort *)&pCVar1->field_0x14 & 0xfeff;
  }
  return;
}

Assistant:

void CVmObjTable::remove_post_load_init(vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* find the entry */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));

    /* if we found the entry, remove it from the table and delete it */
    if (entry != 0)
    {
        /* remove it */
        post_load_init_table_->remove(entry);

        /* delete it */
        delete entry;

        /* mark the entry as no longer being registered for post-load init */
        get_entry(obj)->requested_post_load_init_ = FALSE;
    }
}